

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[5],char_const(&)[3],kj::CappedArray<char,17ul>,char_const(&)[19],unsigned_long,char_const(&)[3],unsigned_int,char_const(&)[11]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [5],char (*params_1) [3],
          CappedArray<char,_17UL> *params_2,char (*params_3) [19],unsigned_long *params_4,
          char (*params_5) [3],uint *params_6,char (*params_7) [11])

{
  char (*value) [5];
  char (*pacVar1) [3];
  CappedArray<char,_17UL> *value_00;
  char (*value_01) [19];
  unsigned_long *value_02;
  uint *value_03;
  char (*value_04) [11];
  ArrayPtr<const_char> *in_stack_ffffffffffffff10;
  ArrayPtr<const_char> local_d8;
  CappedArray<char,_14UL> local_c8;
  ArrayPtr<const_char> local_b0;
  CappedArray<char,_26UL> local_a0;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [19];
  unsigned_long *params_local_4;
  char (*params_local_3) [19];
  CappedArray<char,_17UL> *params_local_2;
  char (*params_local_1) [3];
  char (*params_local) [5];
  
  local_38 = params_3;
  params_local_4 = &params_2->currentSize;
  params_local_3 = (char (*) [19])params_1;
  params_local_2 = (CappedArray<char,_17UL> *)params;
  params_local_1 = (char (*) [3])this;
  params_local = (char (*) [5])__return_storage_ptr__;
  value = ::const((char (*) [5])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[5]>(value);
  pacVar1 = ::const((char (*) [3])params_local_2);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[3]>(pacVar1);
  value_00 = fwd<kj::CappedArray<char,17ul>>
                       ((NoInfer<kj::CappedArray<char,_17UL>_> *)params_local_3);
  local_68 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>>(value_00);
  value_01 = ::const((char (*) [19])params_local_4);
  local_78 = _::toStringTreeOrCharSequence<char_const(&)[19]>(value_01);
  value_02 = fwd<unsigned_long>((NoInfer<unsigned_long> *)local_38);
  _::toStringTreeOrCharSequence<unsigned_long>(&local_a0,value_02);
  pacVar1 = ::const((char (*) [3])params_4);
  local_b0 = _::toStringTreeOrCharSequence<char_const(&)[3]>(pacVar1);
  value_03 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_5);
  _::toStringTreeOrCharSequence<unsigned_int>(&local_c8,value_03);
  value_04 = ::const((char (*) [11])params_6);
  local_d8 = _::toStringTreeOrCharSequence<char_const(&)[11]>(value_04);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_58,&local_68,&local_78,
             (ArrayPtr<const_char> *)&local_a0,(CappedArray<char,_26UL> *)&local_b0,
             (ArrayPtr<const_char> *)&local_c8,(CappedArray<char,_14UL> *)&local_d8,
             in_stack_ffffffffffffff10);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}